

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O0

Clause * __thiscall Inferences::DistinctnessISE::simplify(DistinctnessISE *this,Clause *c)

{
  bool bVar1;
  Literal **ppLVar2;
  Clause *pCVar3;
  Clause *in_RSI;
  Inference *in_stack_00000030;
  uint in_stack_0000003c;
  Clause *in_stack_00000040;
  Clause *res;
  Literal *lit;
  int i;
  int length;
  SimplifyingInference1 *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SimplifyingInference1 local_70;
  Inference local_60;
  Literal *local_28;
  uint local_20;
  uint local_1c;
  Clause *local_18;
  Clause *local_8;
  
  local_18 = in_RSI;
  bVar1 = Kernel::Unit::isPureTheoryDescendant((Unit *)0x838dc4);
  if (bVar1) {
    local_8 = local_18;
  }
  else {
    local_1c = Kernel::Clause::length(local_18);
    local_20 = local_1c;
    do {
      local_20 = local_20 - 1;
      if ((int)local_20 < 0) {
        return local_18;
      }
      ppLVar2 = Kernel::Clause::operator[](local_18,local_20);
      local_28 = *ppLVar2;
      bVar1 = distinctConstructorsEquality
                        ((Literal *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    } while (!bVar1);
    bVar1 = Kernel::Literal::isPositive((Literal *)0x838e54);
    if (bVar1) {
      this_00 = &local_70;
      Kernel::SimplifyingInference1::SimplifyingInference1
                (this_00,TERM_ALGEBRA_DISTINCTNESS,local_18);
      Kernel::Inference::Inference((Inference *)local_18,this_00);
      pCVar3 = removeLit(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
      Kernel::Inference::~Inference(&local_60);
      *(int *)(DAT_01333840 + 0x1bc) = *(int *)(DAT_01333840 + 0x1bc) + 1;
      local_8 = pCVar3;
    }
    else {
      *(int *)(DAT_01333840 + 0x1c0) = *(int *)(DAT_01333840 + 0x1c0) + 1;
      local_8 = (Clause *)0x0;
    }
  }
  return local_8;
}

Assistant:

Clause* DistinctnessISE::simplify(Clause* c)
  {
    if (c->isPureTheoryDescendant())
      return c;
    
    int length = c->length();
    for (int i = length - 1; i >= 0; i--) {
      Literal *lit = (*c)[i];
      if (distinctConstructorsEquality(lit)) {
        if (lit->isPositive()) {
          // equality of the form f(x) = g(y), delete literal from clause
          Clause* res = removeLit(c, i, SimplifyingInference1(InferenceRule::TERM_ALGEBRA_DISTINCTNESS, c));
          env.statistics->taDistinctnessSimplifications++;
          return res;
        } else {
          // inequality of the form f(x) != g(y) are theory tautologies
          env.statistics->taDistinctnessTautologyDeletions++;
          return 0;
        }
      }
    }

    // no equalities between distinct constructors were found
    return c;
  }